

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O1

void duckdb::PragmaTableInfoHelper::GetViewColumns
               (idx_t i,string *name,LogicalType *type,DataChunk *output,idx_t index)

{
  pointer pcVar1;
  Value local_c0;
  LogicalType local_80;
  string local_68;
  string local_48;
  
  Value::INTEGER(&local_c0,(int32_t)i);
  DataChunk::SetValue(output,0,index,&local_c0);
  Value::~Value(&local_c0);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + name->_M_string_length);
  Value::Value(&local_c0,&local_68);
  DataChunk::SetValue(output,1,index,&local_c0);
  Value::~Value(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  LogicalType::ToString_abi_cxx11_(&local_48,type);
  Value::Value(&local_c0,&local_48);
  DataChunk::SetValue(output,2,index,&local_c0);
  Value::~Value(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  Value::BOOLEAN(&local_c0,false);
  DataChunk::SetValue(output,3,index,&local_c0);
  Value::~Value(&local_c0);
  LogicalType::LogicalType(&local_80,SQLNULL);
  Value::Value(&local_c0,&local_80);
  DataChunk::SetValue(output,4,index,&local_c0);
  Value::~Value(&local_c0);
  LogicalType::~LogicalType(&local_80);
  Value::BOOLEAN(&local_c0,false);
  DataChunk::SetValue(output,5,index,&local_c0);
  Value::~Value(&local_c0);
  return;
}

Assistant:

static void GetViewColumns(idx_t i, const string &name, const LogicalType &type, DataChunk &output, idx_t index) {
		// return values:
		// "cid", PhysicalType::INT32
		output.SetValue(0, index, Value::INTEGER((int32_t)i));
		// "name", PhysicalType::VARCHAR
		output.SetValue(1, index, Value(name));
		// "type", PhysicalType::VARCHAR
		output.SetValue(2, index, Value(type.ToString()));
		// "notnull", PhysicalType::BOOL
		output.SetValue(3, index, Value::BOOLEAN(false));
		// "dflt_value", PhysicalType::VARCHAR
		output.SetValue(4, index, Value());
		// "pk", PhysicalType::BOOL
		output.SetValue(5, index, Value::BOOLEAN(false));
	}